

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

int __thiscall MODEL3D::three_dim_model::import_process_info(three_dim_model *this,string *pif_path)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  char *pcVar4;
  reference __lhs;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_290;
  is_any_ofF<char> local_288;
  undefined1 local_270 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_string_vector;
  int line_number;
  undefined1 local_248 [8];
  string file_buffer;
  fstream geo_file;
  string *pif_path_local;
  three_dim_model *this_local;
  
  std::fstream::fstream((string *)(file_buffer.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_248);
  std::fstream::open((string *)(file_buffer.field_2._M_local_buf + 8),(_Ios_Openmode)pif_path);
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) != 0) {
    split_string_vector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(file_buffer.field_2._M_local_buf + 8),(string *)local_248);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_248);
      if (*pcVar4 != '*') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_270);
        boost::algorithm::is_any_of<char[2]>(&local_288,(char (*) [2])0x1f6e19);
        boost::algorithm::
        split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_270,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                   &local_288,token_compress_off);
        boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_288);
        GEO::trim_string_vector
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_270);
        local_290._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_270);
        __lhs = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_290);
        bVar2 = std::operator==(__lhs,"$Layer");
        if (bVar2) {
          import_layer_block(this,(fstream *)(file_buffer.field_2._M_local_buf + 8),
                             (string *)local_248,
                             (int *)&split_string_vector.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_270);
      }
      split_string_vector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)split_string_vector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
    }
    std::fstream::close();
  }
  std::__cxx11::string::~string((string *)local_248);
  std::fstream::~fstream((void *)((long)&file_buffer.field_2 + 8));
  return 0;
}

Assistant:

int MODEL3D::three_dim_model::import_process_info(const std::string &pif_path)
{
    std::fstream geo_file;
    std::string file_buffer;
    geo_file.open(pif_path, std::ios::in);
    if (geo_file.is_open())
    {
        int line_number =1;
        while (getline(geo_file, file_buffer))
        {
            if (file_buffer[0]!='*')
            {
                std::vector<std::string> split_string_vector;
                boost::split(split_string_vector, file_buffer, boost::is_any_of("="));
                GEO::trim_string_vector(split_string_vector);
                if (*split_string_vector.begin()=="$Layer")
                {
                    import_layer_block(geo_file, file_buffer, line_number);
                }
            }
            line_number++;
        }
        geo_file.close();
    }
    return EXIT_SUCCESS;
}